

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::SIMDReplace::finalize(SIMDReplace *this)

{
  bool bVar1;
  bool local_39;
  Type local_28;
  BasicType local_20 [2];
  Type local_18;
  SIMDReplace *local_10;
  SIMDReplace *this_local;
  
  bVar1 = false;
  if (this->vec != (Expression *)0x0) {
    bVar1 = this->value != (Expression *)0x0;
  }
  local_10 = this;
  if (bVar1) {
    wasm::Type::Type(&local_18,v128);
    (this->super_SpecificExpression<(wasm::Expression::Id)30>).super_Expression.type.id =
         local_18.id;
    local_20[1] = 1;
    bVar1 = wasm::Type::operator==(&this->vec->type,local_20 + 1);
    local_39 = true;
    if (!bVar1) {
      local_20[0] = unreachable;
      local_39 = wasm::Type::operator==(&this->value->type,local_20);
    }
    if (local_39 != false) {
      wasm::Type::Type(&local_28,unreachable);
      (this->super_SpecificExpression<(wasm::Expression::Id)30>).super_Expression.type.id =
           local_28.id;
    }
    return;
  }
  __assert_fail("vec && value",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x192,"void wasm::SIMDReplace::finalize()");
}

Assistant:

void SIMDReplace::finalize() {
  assert(vec && value);
  type = Type::v128;
  if (vec->type == Type::unreachable || value->type == Type::unreachable) {
    type = Type::unreachable;
  }
}